

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

void Cgt_ManDetectCandidates_rec
               (Aig_Man_t *pAig,Vec_Int_t *vUseful,Aig_Obj_t *pObj,int nLevelMax,Vec_Ptr_t *vCands)

{
  int iVar1;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
      Cgt_ManDetectCandidates_rec
                (pAig,vUseful,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),nLevelMax,
                 vCands);
      Cgt_ManDetectCandidates_rec
                (pAig,vUseful,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),nLevelMax,
                 vCands);
    }
    iVar1 = Aig_ObjLevel(pObj);
    if (iVar1 <= nLevelMax) {
      if ((vUseful != (Vec_Int_t *)0x0) && (iVar1 = Vec_IntEntry(vUseful,pObj->Id), iVar1 == 0)) {
        return;
      }
      Vec_PtrPush(vCands,pObj);
      return;
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes transitive fanout cone of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cgt_ManDetectCandidates_rec( Aig_Man_t * pAig, Vec_Int_t * vUseful, Aig_Obj_t * pObj, int nLevelMax, Vec_Ptr_t * vCands )
{
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin0(pObj), nLevelMax, vCands );
        Cgt_ManDetectCandidates_rec( pAig, vUseful, Aig_ObjFanin1(pObj), nLevelMax, vCands );
    }
    if ( Aig_ObjLevel(pObj) <= nLevelMax && (vUseful == NULL || Vec_IntEntry(vUseful, Aig_ObjId(pObj))) )
        Vec_PtrPush( vCands, pObj );
}